

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O1

void __thiscall SQClass::SQClass(SQClass *this,SQVM *v,SQClass *base)

{
  long *plVar1;
  SQUnsignedInteger *pSVar2;
  undefined8 *puVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  uint uVar6;
  SQAllocContext pSVar7;
  SQSharedState *ss;
  long *plVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  SQInteger SVar12;
  long lVar13;
  SQTable *this_00;
  EVP_PKEY_CTX *src;
  
  (this->super_SQCollectable).super_SQRefCounted._uiRef = 0;
  (this->super_SQCollectable).super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQClass_001a4f88;
  pSVar7 = v->_sharedstate->_alloc_ctx;
  (this->_defaultvalues)._vals = (SQClassMember *)0x0;
  (this->_defaultvalues)._alloc_ctx = pSVar7;
  (this->_defaultvalues)._size = 0;
  (this->_defaultvalues)._allocated = 0;
  (this->_methods)._vals = (SQClassMember *)0x0;
  (this->_methods)._alloc_ctx = pSVar7;
  (this->_methods)._size = 0;
  (this->_methods)._allocated = 0;
  lVar13 = 0x70;
  do {
    puVar3 = (undefined8 *)
             ((long)&(((SQClass *)(this->_metamethods + -7))->super_SQCollectable).
                     super_SQRefCounted._vptr_SQRefCounted + lVar13);
    *puVar3 = 0;
    puVar3[1] = 0;
    *(undefined4 *)
     ((long)&(((SQClass *)(this->_metamethods + -7))->super_SQCollectable).super_SQRefCounted.
             _vptr_SQRefCounted + lVar13) = 0x1000001;
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x180);
  ss = v->_sharedstate;
  this->_base = base;
  this->_udsize = 0;
  this->_lockedTypeId = 0;
  this->_typetag = (SQUserPointer)0x0;
  this->_hook = (SQRELEASEHOOK)0x0;
  this->_constructoridx = -1;
  if (base != (SQClass *)0x0) {
    SVar12 = base->_udsize;
    this->_constructoridx = base->_constructoridx;
    this->_udsize = SVar12;
    sqvector<SQClassMember,_unsigned_int>::copy
              (&this->_defaultvalues,(EVP_PKEY_CTX *)&base->_defaultvalues,(EVP_PKEY_CTX *)base);
    sqvector<SQClassMember,_unsigned_int>::copy(&this->_methods,(EVP_PKEY_CTX *)&base->_methods,src)
    ;
    lVar13 = 0;
    do {
      uVar6 = *(uint *)((long)&this->_metamethods[0].super_SQObject._type + lVar13);
      plVar8 = *(long **)((long)&this->_metamethods[0].super_SQObject._unVal + lVar13);
      puVar4 = (undefined4 *)((long)&base->_metamethods[0].super_SQObject._type + lVar13);
      uVar9 = puVar4[1];
      uVar10 = puVar4[2];
      uVar11 = puVar4[3];
      puVar5 = (undefined4 *)((long)&this->_metamethods[0].super_SQObject._type + lVar13);
      *puVar5 = *puVar4;
      puVar5[1] = uVar9;
      puVar5[2] = uVar10;
      puVar5[3] = uVar11;
      if ((*(byte *)((long)&this->_metamethods[0].super_SQObject._type + lVar13 + 3) & 8) != 0) {
        plVar1 = (long *)(*(long *)((long)&this->_metamethods[0].super_SQObject._unVal + lVar13) + 8
                         );
        *plVar1 = *plVar1 + 1;
      }
      if ((uVar6 >> 0x1b & 1) != 0) {
        plVar1 = plVar8 + 1;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (**(code **)(*plVar8 + 0x10))();
        }
      }
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x110);
    pSVar2 = &(this->_base->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar2 = *pSVar2 + 1;
    if (base != (SQClass *)0x0) {
      this_00 = SQTable::Clone(base->_members);
      goto LAB_0012f84c;
    }
  }
  this_00 = (SQTable *)sq_vm_malloc(ss->_alloc_ctx,0x60);
  SQTable::SQTable(this_00,ss,0);
  (this_00->super_SQDelegable)._delegate = (SQTable *)0x0;
LAB_0012f84c:
  this->_members = this_00;
  pSVar2 = &(this_00->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar2 = *pSVar2 + 1;
  (this->super_SQCollectable)._gc_next = (SQCollectable *)0x0;
  (this->super_SQCollectable)._gc_prev = (SQCollectable *)0x0;
  (this->super_SQCollectable)._sharedstate = ss;
  SQCollectable::AddToChain(&ss->_gc_chain,(SQCollectable_conflict *)this);
  return;
}

Assistant:

SQClass::SQClass(SQVM *v, SQClass *base) :
    _defaultvalues(_ss(v)->_alloc_ctx),
    _methods(_ss(v)->_alloc_ctx)
{
    SQSharedState *ss = _ss(v);

    _base = base;
    _typetag = 0;
    _hook = NULL;
    _udsize = 0;
    _constructoridx = -1;
    _lockedTypeId = 0;
    if(_base) {
        _constructoridx = _base->_constructoridx;
        _udsize = _base->_udsize;
        _defaultvalues.copy(base->_defaultvalues);
        _methods.copy(base->_methods);
        _COPY_VECTOR(_metamethods,base->_metamethods,MT_NUM_METHODS);
        __ObjAddRef(_base);
    }
    _members = base?base->_members->Clone() : SQTable::Create(ss,0);
    __ObjAddRef(_members);

    INIT_CHAIN();
    ADD_TO_CHAIN(&_sharedstate->_gc_chain, this);
}